

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-copyfile.c
# Opt level: O0

int run_test_fs_copyfile(void)

{
  int iVar1;
  undefined1 local_1d8 [4];
  int r;
  uv_fs_t req;
  uv_loop_t *loop;
  char cStack_10;
  char cStack_f;
  char src [14];
  
  loop._2_1_ = 't';
  loop._3_1_ = 'e';
  loop._4_1_ = 's';
  loop._5_1_ = 't';
  loop._6_1_ = '_';
  loop._7_1_ = 'f';
  cStack_10 = 'i';
  cStack_f = 'l';
  builtin_strncpy(src,"e_src",6);
  req.bufsml[3].len = uv_default_loop();
  iVar1 = uv_fs_copyfile(0,local_1d8,(long)&loop + 2,"test_file_dst",0xffffffff);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-copyfile.c"
            ,0x6c,"r == UV_EINVAL");
    abort();
  }
  uv_fs_req_cleanup(local_1d8);
  unlink((char *)((long)&loop + 2));
  unlink("test_file_dst");
  iVar1 = uv_fs_copyfile(0,local_1d8,(long)&loop + 2,"test_file_dst",0);
  if (req.cb != (uv_fs_cb)0xfffffffffffffffe) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-copyfile.c"
            ,0x73,"req.result == UV_ENOENT");
    abort();
  }
  if (iVar1 != -2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-copyfile.c"
            ,0x74,"r == UV_ENOENT");
    abort();
  }
  uv_fs_req_cleanup(local_1d8);
  iVar1 = uv_fs_stat(0,local_1d8,"test_file_dst");
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-copyfile.c"
            ,0x78,"r != 0");
    abort();
  }
  uv_fs_req_cleanup(local_1d8);
  touch_file((char *)((long)&loop + 2),0xc);
  iVar1 = uv_fs_copyfile(0,local_1d8,(long)&loop + 2,(long)&loop + 2,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-copyfile.c"
            ,0x7e,"r == 0");
    abort();
  }
  uv_fs_req_cleanup(local_1d8);
  unlink((char *)((long)&loop + 2));
  unlink("test_file_dst");
  iVar1 = uv_fs_copyfile(0,local_1d8,"test/fixtures/load_error.node","test_file_dst",0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-copyfile.c"
            ,0x85,"r == 0");
    abort();
  }
  handle_result((uv_fs_t *)local_1d8);
  unlink("test_file_dst");
  touch_file((char *)((long)&loop + 2),0);
  iVar1 = uv_fs_copyfile(0,local_1d8,(long)&loop + 2,"test_file_dst",0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-copyfile.c"
            ,0x8c,"r == 0");
    abort();
  }
  handle_result((uv_fs_t *)local_1d8);
  iVar1 = uv_fs_copyfile(0,local_1d8,"test/fixtures/load_error.node","test_file_dst",0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-copyfile.c"
            ,0x91,"r == 0");
    abort();
  }
  handle_result((uv_fs_t *)local_1d8);
  iVar1 = uv_fs_copyfile(0,local_1d8,"test/fixtures/load_error.node","test_file_dst",1);
  if (iVar1 != -0x11) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-copyfile.c"
            ,0x96,"r == UV_EEXIST");
    abort();
  }
  uv_fs_req_cleanup(local_1d8);
  touch_file((char *)((long)&loop + 2),1);
  iVar1 = uv_fs_copyfile(0,local_1d8,(long)&loop + 2,"test_file_dst",0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-copyfile.c"
            ,0x9c,"r == 0");
    abort();
  }
  handle_result((uv_fs_t *)local_1d8);
  unlink("test_file_dst");
  touch_file((char *)((long)&loop + 2),0x2000);
  iVar1 = uv_fs_copyfile(0,local_1d8,(long)&loop + 2,"test_file_dst",0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-copyfile.c"
            ,0xa3,"r == 0");
    abort();
  }
  handle_result((uv_fs_t *)local_1d8);
  unlink((char *)((long)&loop + 2));
  unlink("test_file_dst");
  iVar1 = uv_fs_copyfile(req.bufsml[3].len,local_1d8,"test/fixtures/load_error.node","test_file_dst"
                         ,0,handle_result);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-copyfile.c"
            ,0xaa,"r == 0");
    abort();
  }
  if (result_check_count != 5) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-copyfile.c"
            ,0xab,"result_check_count == 5");
    abort();
  }
  uv_run(req.bufsml[3].len,0);
  if (result_check_count != 6) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-copyfile.c"
            ,0xad,"result_check_count == 6");
    abort();
  }
  unlink("test_file_dst");
  iVar1 = uv_fs_copyfile(req.bufsml[3].len,local_1d8,"test/fixtures/load_error.node","test_file_dst"
                         ,0xffffffff,fail_cb);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-copyfile.c"
            ,0xb2,"r == UV_EINVAL");
    abort();
  }
  uv_run(req.bufsml[3].len,0);
  unlink("test_file_dst");
  iVar1 = uv_fs_copyfile(0,local_1d8,"test/fixtures/load_error.node","test_file_dst",2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-copyfile.c"
            ,0xb8,"r == 0");
    abort();
  }
  handle_result((uv_fs_t *)local_1d8);
  unlink("test_file_dst");
  iVar1 = uv_fs_copyfile(0,local_1d8,"test/fixtures/load_error.node","test_file_dst",4);
  if (0 < iVar1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-copyfile.c"
            ,0xbf,"r <= 0");
    abort();
  }
  if (iVar1 == 0) {
    handle_result((uv_fs_t *)local_1d8);
  }
  unlink("test_file_dst");
  touch_file("test_file_dst",0);
  chmod("test_file_dst",0x124);
  iVar1 = uv_fs_copyfile(0,local_1d8,"test/fixtures/load_error.node","test_file_dst",0);
  if (req.cb != (uv_fs_cb)0xfffffffffffffff3) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-copyfile.c"
            ,0xcc,"req.result == UV_EACCES");
    abort();
  }
  if (iVar1 != -0xd) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-copyfile.c"
            ,0xcd,"r == UV_EACCES");
    abort();
  }
  uv_fs_req_cleanup(local_1d8);
  unlink("test_file_dst");
  return 0;
}

Assistant:

TEST_IMPL(fs_copyfile) {
  const char src[] = "test_file_src";
  uv_loop_t* loop;
  uv_fs_t req;
  int r;

  loop = uv_default_loop();

  /* Fails with EINVAL if bad flags are passed. */
  r = uv_fs_copyfile(NULL, &req, src, dst, -1, NULL);
  ASSERT(r == UV_EINVAL);
  uv_fs_req_cleanup(&req);

  /* Fails with ENOENT if source does not exist. */
  unlink(src);
  unlink(dst);
  r = uv_fs_copyfile(NULL, &req, src, dst, 0, NULL);
  ASSERT(req.result == UV_ENOENT);
  ASSERT(r == UV_ENOENT);
  uv_fs_req_cleanup(&req);
  /* The destination should not exist. */
  r = uv_fs_stat(NULL, &req, dst, NULL);
  ASSERT(r != 0);
  uv_fs_req_cleanup(&req);

  /* Succeeds if src and dst files are identical. */
  touch_file(src, 12);
  r = uv_fs_copyfile(NULL, &req, src, src, 0, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&req);
  unlink(src);

  /* Copies file synchronously. Creates new file. */
  unlink(dst);
  r = uv_fs_copyfile(NULL, &req, fixture, dst, 0, NULL);
  ASSERT(r == 0);
  handle_result(&req);

  /* Copies a file of size zero. */
  unlink(dst);
  touch_file(src, 0);
  r = uv_fs_copyfile(NULL, &req, src, dst, 0, NULL);
  ASSERT(r == 0);
  handle_result(&req);

  /* Copies file synchronously. Overwrites existing file. */
  r = uv_fs_copyfile(NULL, &req, fixture, dst, 0, NULL);
  ASSERT(r == 0);
  handle_result(&req);

  /* Fails to overwrites existing file. */
  r = uv_fs_copyfile(NULL, &req, fixture, dst, UV_FS_COPYFILE_EXCL, NULL);
  ASSERT(r == UV_EEXIST);
  uv_fs_req_cleanup(&req);

  /* Truncates when an existing destination is larger than the source file. */
  touch_file(src, 1);
  r = uv_fs_copyfile(NULL, &req, src, dst, 0, NULL);
  ASSERT(r == 0);
  handle_result(&req);

  /* Copies a larger file. */
  unlink(dst);
  touch_file(src, 4096 * 2);
  r = uv_fs_copyfile(NULL, &req, src, dst, 0, NULL);
  ASSERT(r == 0);
  handle_result(&req);
  unlink(src);

  /* Copies file asynchronously */
  unlink(dst);
  r = uv_fs_copyfile(loop, &req, fixture, dst, 0, handle_result);
  ASSERT(r == 0);
  ASSERT(result_check_count == 5);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(result_check_count == 6);

  /* If the flags are invalid, the loop should not be kept open */
  unlink(dst);
  r = uv_fs_copyfile(loop, &req, fixture, dst, -1, fail_cb);
  ASSERT(r == UV_EINVAL);
  uv_run(loop, UV_RUN_DEFAULT);

  /* Copies file using UV_FS_COPYFILE_FICLONE. */
  unlink(dst);
  r = uv_fs_copyfile(NULL, &req, fixture, dst, UV_FS_COPYFILE_FICLONE, NULL);
  ASSERT(r == 0);
  handle_result(&req);

  /* Copies file using UV_FS_COPYFILE_FICLONE_FORCE. */
  unlink(dst);
  r = uv_fs_copyfile(NULL, &req, fixture, dst, UV_FS_COPYFILE_FICLONE_FORCE,
                     NULL);
  ASSERT(r <= 0);

  if (r == 0)
    handle_result(&req);

#ifndef _WIN32
  /* Copying respects permissions/mode. */
  unlink(dst);
  touch_file(dst, 0);
  chmod(dst, S_IRUSR|S_IRGRP|S_IROTH); /* Sets file mode to 444 (read-only). */
  r = uv_fs_copyfile(NULL, &req, fixture, dst, 0, NULL);
  /* On IBMi PASE, qsecofr users can overwrite read-only files */
# ifndef __PASE__
  ASSERT(req.result == UV_EACCES);
  ASSERT(r == UV_EACCES);
# endif
  uv_fs_req_cleanup(&req);
#endif

  unlink(dst); /* Cleanup */
  return 0;
}